

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

int filesrc_getByte(void *sourceData)

{
  undefined4 local_1c;
  int bv;
  FileSource *fin;
  void *sourceData_local;
  
  if (*(int *)((long)sourceData + 0x18) == 0) {
    local_1c = fgetc(*sourceData);
  }
  else {
    local_1c = tidyBufPopByte((TidyBuffer *)((long)sourceData + 8));
  }
  return local_1c;
}

Assistant:

static int TIDY_CALL filesrc_getByte( void* sourceData )
{
  FileSource* fin = (FileSource*) sourceData;
  int bv;
  if ( fin->unget.size > 0 )
    bv = tidyBufPopByte( &fin->unget );
  else
    bv = fgetc( fin->fp );
  return bv;
}